

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O1

void __thiscall
asmjit::v1_14::x86::X86BufferWriter::emitImmByteOrDWord
          (X86BufferWriter *this,uint64_t immValue,FastUInt8 immSize)

{
  uint8_t *puVar1;
  int iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = (int)CONCAT71(in_register_00000011,immSize);
  if (iVar2 != 0) {
    if ((iVar2 != 1) && (iVar2 != 4)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86assembler.cpp"
                 ,0x187,"immSize == 1 || immSize == 4");
    }
    *(this->super_CodeWriter)._cursor = (uint8_t)immValue;
    puVar1 = (this->super_CodeWriter)._cursor + 1;
    (this->super_CodeWriter)._cursor = puVar1;
    if (immSize != '\x01') {
      *puVar1 = (uint8_t)(immValue >> 8);
      puVar1 = (this->super_CodeWriter)._cursor;
      (this->super_CodeWriter)._cursor = puVar1 + 1;
      puVar1[1] = (uint8_t)(immValue >> 0x10);
      puVar1 = (this->super_CodeWriter)._cursor;
      (this->super_CodeWriter)._cursor = puVar1 + 1;
      puVar1[1] = (uint8_t)(immValue >> 0x18);
      (this->super_CodeWriter)._cursor = (this->super_CodeWriter)._cursor + 1;
    }
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void emitImmByteOrDWord(uint64_t immValue, FastUInt8 immSize) noexcept {
    if (!immSize)
      return;

    ASMJIT_ASSERT(immSize == 1 || immSize == 4);

#if ASMJIT_ARCH_BITS >= 64
    uint64_t imm = uint64_t(immValue);
#else
    uint32_t imm = uint32_t(immValue & 0xFFFFFFFFu);
#endif

    // Many instructions just use a single byte immediate, so make it fast.
    emit8(imm & 0xFFu);
    if (immSize == 1) return;

    imm >>= 8;
    emit8(imm & 0xFFu);
    imm >>= 8;
    emit8(imm & 0xFFu);
    imm >>= 8;
    emit8(imm & 0xFFu);
  }